

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool OptionValueIdentical(TidyOptionImpl *option,TidyOptionValue *val1,TidyOptionValue *val2)

{
  ctmbstr s1;
  ctmbstr s2;
  int iVar1;
  bool bVar2;
  
  if (option->type == TidyString) {
    s1 = val1->p;
    s2 = val2->p;
    if (s1 == s2) {
      bVar2 = true;
    }
    else if (s2 == (ctmbstr)0x0 || s1 == (ctmbstr)0x0) {
      bVar2 = false;
    }
    else {
      iVar1 = prvTidytmbstrcmp(s1,s2);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = val1->v == val2->v;
  }
  return (Bool)bVar2;
}

Assistant:

static Bool OptionValueIdentical( const TidyOptionImpl* option,
                                  const TidyOptionValue* val1,
                                  const TidyOptionValue* val2 )
{
    if ( option->type == TidyString )
    {
        if ( val1->p == val2->p )
            return yes;
        if ( !val1->p || !val2->p )
            return no;
        return TY_(tmbstrcmp)( val1->p, val2->p ) == 0;
    }
    else
        return val1->v == val2->v;
}